

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

void setnodevector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  Node *pNVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    pNVar2 = (Node *)0x0;
  }
  else {
    uVar1 = luaO_ceillog2(size);
    if (0x1e < uVar1) {
      luaG_runerror(L,"table overflow");
    }
    bVar4 = (byte)uVar1;
    uVar6 = (ulong)(uint)(1 << (bVar4 & 0x1f));
    pNVar2 = (Node *)luaM_malloc_(L,0x18L << (bVar4 & 0x3f),0);
    t->node = pNVar2;
    lVar3 = 0xc;
    uVar5 = uVar6;
    do {
      pNVar2 = t->node;
      *(undefined4 *)((long)pNVar2 + lVar3) = 0;
      *(undefined2 *)((long)pNVar2 + lVar3 + -4) = 0x10;
      lVar3 = lVar3 + 0x18;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    t->lsizenode = bVar4;
    pNVar2 = t->node + uVar6;
  }
  t->lastfree = pNVar2;
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS || (1u << lsize) > MAXHSIZE)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < cast_int(size); i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilkey(n);
      setempty(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}